

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infback.c
# Opt level: O0

int inflateBackInit_(z_streamp strm,int windowBits,uchar *window,char *version,int stream_size)

{
  internal_state *piVar1;
  inflate_state *state;
  int stream_size_local;
  char *version_local;
  uchar *window_local;
  int windowBits_local;
  z_streamp strm_local;
  
  if (((version == (char *)0x0) || (*version != '1')) || (stream_size != 0x70)) {
    strm_local._4_4_ = -6;
  }
  else if (((strm == (z_streamp)0x0) || (window == (uchar *)0x0)) ||
          ((windowBits < 8 || (0xf < windowBits)))) {
    strm_local._4_4_ = -2;
  }
  else {
    strm->msg = (char *)0x0;
    if (strm->zalloc == (alloc_func)0x0) {
      strm->zalloc = zcalloc;
      strm->opaque = (voidpf)0x0;
    }
    if (strm->zfree == (free_func)0x0) {
      strm->zfree = zcfree;
    }
    piVar1 = (internal_state *)(*strm->zalloc)(strm->opaque,1,0x2378);
    if (piVar1 == (internal_state *)0x0) {
      strm_local._4_4_ = -4;
    }
    else {
      strm->state = piVar1;
      *(undefined4 *)((long)&piVar1->pending_buf_size + 4) = 0x8000;
      *(int *)&piVar1->gzhead = windowBits;
      *(int *)((long)&piVar1->gzhead + 4) = 1 << ((byte)windowBits & 0x1f);
      *(uchar **)&piVar1->method = window;
      *(undefined4 *)((long)&piVar1->gzindex + 4) = 0;
      *(undefined4 *)&piVar1->gzindex = 0;
      piVar1[1].d_desc.max_code = 1;
      strm_local._4_4_ = 0;
    }
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflateBackInit_(z_streamp strm, int windowBits,
                             unsigned char FAR *window, const char *version,
                             int stream_size) {
    struct inflate_state FAR *state;

    if (version == Z_NULL || version[0] != ZLIB_VERSION[0] ||
        stream_size != (int)(sizeof(z_stream)))
        return Z_VERSION_ERROR;
    if (strm == Z_NULL || window == Z_NULL ||
        windowBits < 8 || windowBits > 15)
        return Z_STREAM_ERROR;
    strm->msg = Z_NULL;                 /* in case we return an error */
    if (strm->zalloc == (alloc_func)0) {
#ifdef Z_SOLO
        return Z_STREAM_ERROR;
#else
        strm->zalloc = zcalloc;
        strm->opaque = (voidpf)0;
#endif
    }
    if (strm->zfree == (free_func)0)
#ifdef Z_SOLO
        return Z_STREAM_ERROR;
#else
    strm->zfree = zcfree;
#endif
    state = (struct inflate_state FAR *)ZALLOC(strm, 1,
                                               sizeof(struct inflate_state));
    if (state == Z_NULL) return Z_MEM_ERROR;
    Tracev((stderr, "inflate: allocated\n"));
    strm->state = (struct internal_state FAR *)state;
    state->dmax = 32768U;
    state->wbits = (uInt)windowBits;
    state->wsize = 1U << windowBits;
    state->window = window;
    state->wnext = 0;
    state->whave = 0;
    state->sane = 1;
    return Z_OK;
}